

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::AppendNoCheck(SnappyIOVecWriter *this,char *ip,size_t len)

{
  iovec *piVar1;
  char *__dest;
  size_t __n;
  
  for (; len != 0; len = len - __n) {
    __n = this->curr_iov_remaining_;
    if (__n == 0) {
      piVar1 = this->curr_iov_;
      if (this->output_iov_end_ <= piVar1 + 1) break;
      this->curr_iov_ = piVar1 + 1;
      __dest = (char *)piVar1[1].iov_base;
      this->curr_iov_output_ = __dest;
      __n = piVar1[1].iov_len;
      this->curr_iov_remaining_ = __n;
    }
    else {
      __dest = this->curr_iov_output_;
    }
    if (len <= __n) {
      __n = len;
    }
    switchD_016b0717::default(__dest,ip,__n);
    this->curr_iov_output_ = this->curr_iov_output_ + __n;
    this->curr_iov_remaining_ = this->curr_iov_remaining_ - __n;
    this->total_written_ = this->total_written_ + __n;
    ip = ip + __n;
  }
  return len == 0;
}

Assistant:

inline bool AppendNoCheck(const char* ip, size_t len) {
    while (len > 0) {
      if (curr_iov_remaining_ == 0) {
        // This iovec is full. Go to the next one.
        if (curr_iov_ + 1 >= output_iov_end_) {
          return false;
        }
        ++curr_iov_;
        curr_iov_output_ = reinterpret_cast<char*>(curr_iov_->iov_base);
        curr_iov_remaining_ = curr_iov_->iov_len;
      }

      const size_t to_write = std::min(len, curr_iov_remaining_);
      std::memcpy(curr_iov_output_, ip, to_write);
      curr_iov_output_ += to_write;
      curr_iov_remaining_ -= to_write;
      total_written_ += to_write;
      ip += to_write;
      len -= to_write;
    }

    return true;
  }